

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::GroupNode::setMaterial
          (GroupNode *this,Ref<embree::SceneGraph::MaterialNode> *material)

{
  Node *pNVar1;
  bool bVar2;
  long *in_RSI;
  long in_RDI;
  Ref<embree::SceneGraph::Node> *child;
  iterator __end2;
  iterator __begin2;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *__range2;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_stack_ffffffffffffff70;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  local_60;
  reference local_58;
  Ref<embree::SceneGraph::Node> *local_50;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  local_48;
  long local_40;
  reference local_28;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  *local_18;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  *local_10;
  
  local_40 = in_RDI + 0x68;
  local_48._M_current =
       (Ref<embree::SceneGraph::Node> *)
       std::
       vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
       ::begin(in_stack_ffffffffffffff68);
  local_50 = (Ref<embree::SceneGraph::Node> *)
             std::
             vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar2) break;
    local_58 = __gnu_cxx::
               __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator*(&local_48);
    pNVar1 = local_58->ptr;
    local_18 = &local_60;
    local_60._M_current = (Ref<embree::SceneGraph::Node> *)*in_RSI;
    local_28 = local_58;
    if (local_60._M_current != (Ref<embree::SceneGraph::Node> *)0x0) {
      (**(code **)&(local_60._M_current)->ptr->fileName)();
    }
    (*(pNVar1->super_RefCount)._vptr_RefCount[5])(pNVar1,&local_60);
    in_stack_ffffffffffffff70 = &local_60;
    local_10 = in_stack_ffffffffffffff70;
    if (local_60._M_current != (Ref<embree::SceneGraph::Node> *)0x0) {
      (*(code *)((local_60._M_current)->ptr->fileName)._M_string_length)();
    }
    __gnu_cxx::
    __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
    ::operator++(&local_48);
  }
  return;
}

Assistant:

virtual void setMaterial(Ref<MaterialNode> material) {
        for (auto& child : children) child->setMaterial(material);
      }